

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void set_object_name(JSParseState *s,JSAtom name)

{
  JSFunctionDef *pJVar1;
  uint8_t *puVar2;
  JSAtomStruct *pJVar3;
  size_t sVar4;
  long lVar5;
  
  pJVar1 = s->cur_func;
  sVar4 = (size_t)pJVar1->last_opcode_pos;
  if (-1 < (long)sVar4) {
    puVar2 = (pJVar1->byte_code).buf;
    if (puVar2[sVar4] == 0xbf) {
      lVar5 = (long)((pJVar1->last_opcode_pos - *(int *)(puVar2 + sVar4 + 1)) + 1);
      JS_FreeAtom(s->ctx,*(JSAtom *)(puVar2 + lVar5 + 1));
      puVar2 = (pJVar1->byte_code).buf;
      if (0xd1 < (int)name) {
        pJVar3 = s->ctx->rt->atom_array[name];
        (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
      }
      *(JSAtom *)(puVar2 + lVar5 + 1) = name;
      pJVar1->last_opcode_pos = -1;
    }
    else if (puVar2[sVar4] == 'M') {
      (pJVar1->byte_code).size = sVar4;
      pJVar1->last_opcode_pos = -1;
      emit_op(s,'M');
      emit_atom(s,name);
      return;
    }
  }
  return;
}

Assistant:

static void set_object_name(JSParseState *s, JSAtom name)
{
    JSFunctionDef *fd = s->cur_func;
    int opcode;

    opcode = get_prev_opcode(fd);
    if (opcode == OP_set_name) {
        /* XXX: should free atom after OP_set_name? */
        fd->byte_code.size = fd->last_opcode_pos;
        fd->last_opcode_pos = -1;
        emit_op(s, OP_set_name);
        emit_atom(s, name);
    } else if (opcode == OP_set_class_name) {
        int define_class_pos;
        JSAtom atom;
        define_class_pos = fd->last_opcode_pos + 1 -
            get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        assert(fd->byte_code.buf[define_class_pos] == OP_define_class);
        /* for consistency we free the previous atom which is
           JS_ATOM_empty_string */
        atom = get_u32(fd->byte_code.buf + define_class_pos + 1);
        JS_FreeAtom(s->ctx, atom);
        put_u32(fd->byte_code.buf + define_class_pos + 1,
                JS_DupAtom(s->ctx, name));
        fd->last_opcode_pos = -1;
    }
}